

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::executeInitializationOperations(CoreBroker *this,bool iterating)

{
  BrokerBase *this_00;
  UnknownHandleManager *this_01;
  pointer pBVar1;
  string *psVar2;
  BaseTimeCoordinator *pBVar3;
  string_view message;
  string_view message_00;
  byte *__src;
  bool bVar4;
  int iVar5;
  BasicHandleInfo *pBVar6;
  undefined7 in_register_00000031;
  iterator __begin3;
  string *psVar7;
  pointer pBVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  bool useRegex;
  int unmatchedCount;
  string errorString;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  foundAliasHandles;
  ActionMessage init;
  char local_20d;
  int local_20c;
  byte *local_208;
  size_t local_200;
  long local_1f8 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e8;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  code *pcStack_1b0;
  SmallBuffer local_188;
  size_t local_108;
  byte *pbStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined1 local_e8 [8];
  ActionMessage *pAStack_e0;
  code *local_d8;
  code *pcStack_d0;
  
  if ((int)CONCAT71(in_register_00000031,iterating) == 0) {
    this_00 = &this->super_BrokerBase;
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&(this->super_BrokerBase).brokerKey,"**");
    if ((iVar5 == 0) && (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i)) {
      local_f8 = 0x21;
      pcStack_f0 = "Broker started with universal key";
      message._M_str = "Broker started with universal key";
      message._M_len = 0x21;
      name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,
                 name,message,false);
    }
    checkDependencies(this);
    if ((this->mTimeMonitorFederate)._M_string_length != 0) {
      loadTimeMonitor(this,true,(string_view)ZEXT816(0));
    }
    this_01 = &this->unknownHandles;
    bVar4 = UnknownHandleManager::hasUnknowns(this_01);
    if (bVar4) {
      local_1c8._8_4_ = 0;
      local_1c8._12_4_ = 0;
      pcStack_1b0 = CLI::std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2792:44)>
                    ::_M_invoke;
      local_1b8 = CLI::std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2792:44)>
                  ::_M_manager;
      local_1c8._0_8_ = this;
      UnknownHandleManager::processUnknownLinks
                (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
                          *)local_1c8);
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(local_1c8,local_1c8,3);
      }
      local_1e8.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CLI::std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::resize(&local_1e8,4);
      local_20d = '\0';
      local_1b8._0_4_ = 0;
      local_1b8._4_4_ = 0;
      pcStack_1b0 = (code *)0x0;
      local_1c8._0_4_ = cmd_ignore;
      local_1c8._4_4_ = 0;
      local_1c8._8_4_ = 0;
      local_1c8._12_4_ = 0;
      local_1c8._0_8_ = operator_new(0x18);
      *(CoreBroker **)local_1c8._0_8_ = this;
      *(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        **)(local_1c8._0_8_ + 8) = &local_1e8;
      *(char **)(local_1c8._0_8_ + 0x10) = &local_20d;
      pcStack_1b0 = CLI::std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2820:13)>
                    ::_M_invoke;
      local_1b8 = CLI::std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2820:13)>
                  ::_M_manager;
      UnknownHandleManager::processUnknowns
                (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                          *)local_1c8);
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(local_1c8,local_1c8,3);
      }
      psVar7 = ((local_1e8.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar2 = ((local_1e8.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (psVar7 != psVar2) {
        do {
          name_01._M_str = (psVar7->_M_dataplus)._M_p;
          name_01._M_len = psVar7->_M_string_length;
          pBVar6 = HandleManager::getInterfaceHandle(&this->handles,name_01,PUBLICATION);
          findAndNotifyPublicationTargets(this,pBVar6,psVar7);
          psVar7 = psVar7 + 1;
        } while (psVar7 != psVar2);
      }
      psVar7 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar7 != psVar2) {
        do {
          name_02._M_str = (psVar7->_M_dataplus)._M_p;
          name_02._M_len = psVar7->_M_string_length;
          pBVar6 = HandleManager::getInterfaceHandle(&this->handles,name_02,INPUT);
          findAndNotifyInputTargets(this,pBVar6,psVar7);
          psVar7 = psVar7 + 1;
        } while (psVar7 != psVar2);
      }
      psVar7 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar7 != psVar2) {
        do {
          name_03._M_str = (psVar7->_M_dataplus)._M_p;
          name_03._M_len = psVar7->_M_string_length;
          pBVar6 = HandleManager::getInterfaceHandle(&this->handles,name_03,ENDPOINT);
          findAndNotifyEndpointTargets(this,pBVar6,psVar7);
          psVar7 = psVar7 + 1;
        } while (psVar7 != psVar2);
      }
      psVar7 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar7 != psVar2) {
        do {
          name_04._M_str = (psVar7->_M_dataplus)._M_p;
          name_04._M_len = psVar7->_M_string_length;
          pBVar6 = HandleManager::getInterfaceHandle(&this->handles,name_04,FILTER);
          findAndNotifyFilterTargets(this,pBVar6,psVar7);
          psVar7 = psVar7 + 1;
        } while (psVar7 != psVar2);
      }
      if (local_20d == '\x01') {
        local_1c8._8_4_ = 0;
        local_1c8._12_4_ = 0;
        pcStack_1b0 = CLI::std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2874:44)>
                      ::_M_invoke;
        local_1b8 = CLI::std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2874:44)>
                    ::_M_manager;
        local_1c8._0_8_ = this;
        UnknownHandleManager::processUnknowns
                  (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                            *)local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(local_1c8,local_1c8,3);
        }
        local_1c8._0_8_ = (undefined8 *)0x0;
        local_1c8._8_4_ = 0;
        local_1c8._12_4_ = 0;
        pcStack_1b0 = CLI::std::
                      _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2881:44)>
                      ::_M_invoke;
        local_1b8 = CLI::std::
                    _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2881:44)>
                    ::_M_manager;
        UnknownHandleManager::clearUnknownsIf
                  (this_01,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                            *)local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(local_1c8,local_1c8,3);
        }
      }
      if (((this->super_BrokerBase).errorOnUnmatchedConnections == true) &&
         (bVar4 = UnknownHandleManager::hasUnknowns(this_01), bVar4)) {
        local_20c = 0;
        ActionMessage::ActionMessage((ActionMessage *)local_1c8,cmd_error);
        local_1c8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
        local_1c8._4_4_ = 0xfffffffe;
        local_208 = (byte *)local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,"unmatched connections","");
        pcStack_d0 = CLI::std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2898:21)>
                     ::_M_invoke;
        local_d8 = CLI::std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2898:21)>
                   ::_M_manager;
        local_e8 = (undefined1  [8])&local_208;
        pAStack_e0 = (ActionMessage *)&local_20c;
        UnknownHandleManager::processUnknowns
                  (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                            *)local_e8);
        if (local_d8 != (code *)0x0) {
          (*local_d8)(local_e8,local_e8,3);
        }
        local_d8 = (code *)0x0;
        pcStack_d0 = (code *)0x0;
        local_e8._0_4_ = cmd_ignore;
        local_e8._4_4_ = 0;
        pAStack_e0 = (ActionMessage *)0x0;
        local_e8 = (undefined1  [8])operator_new(0x18);
        (((CoreBroker *)local_e8)->super_Broker)._vptr_Broker = (_func_int **)this;
        (((CoreBroker *)local_e8)->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&local_208;
        *(int **)&(((CoreBroker *)local_e8)->super_BrokerBase).global_id = &local_20c;
        pcStack_d0 = CLI::std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2908:21)>
                     ::_M_invoke;
        local_d8 = CLI::std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2908:21)>
                   ::_M_manager;
        UnknownHandleManager::processUnknownLinks
                  (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
                            *)local_e8);
        if (local_d8 != (code *)0x0) {
          (*local_d8)(local_e8,local_e8,3);
        }
        if (0 < local_20c) {
          local_108 = local_200;
          pbStack_100 = local_208;
          message_00._M_str = (char *)local_208;
          message_00._M_len = local_200;
          name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
          BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_00,message_00,false);
          __src = local_208;
          if (local_208 == local_188.heap) {
            local_188.bufferSize = local_200;
          }
          else {
            SmallBuffer::reserve(&local_188,local_200);
            local_188.bufferSize = local_200;
            if (local_200 != 0) {
              memcpy(local_188.heap,__src,local_200);
            }
          }
          local_1b8._4_4_ = -1700000000;
          broadcast(this,(ActionMessage *)local_1c8);
          sendDisconnect(this,cmd_global_disconnect);
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_stop);
          BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
          if (local_208 != (byte *)local_1f8) {
            operator_delete(local_208,local_1f8[0] + 1);
          }
          goto LAB_002ebb2e;
        }
        if (local_208 != (byte *)local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_1c8);
      }
      bVar4 = UnknownHandleManager::hasNonOptionalUnknowns(this_01);
      if (bVar4) {
        bVar4 = UnknownHandleManager::hasRequiredUnknowns(this_01);
        if (bVar4) {
          ActionMessage::ActionMessage((ActionMessage *)local_1c8,cmd_error);
          local_1c8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
          local_1c8._4_4_ = 0xfffffffe;
          pcStack_d0 = CLI::std::
                       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2941:21)>
                       ::_M_invoke;
          local_d8 = CLI::std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2941:21)>
                     ::_M_manager;
          local_e8 = (undefined1  [8])this;
          pAStack_e0 = (ActionMessage *)local_1c8;
          UnknownHandleManager::processRequiredUnknowns
                    (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                              *)local_e8);
          if (local_d8 != (code *)0x0) {
            (*local_d8)(local_e8,local_e8,3);
          }
          SmallBuffer::operator=(&local_188,(char (*) [29])"Missing required connections");
          local_1b8._4_4_ = -1700000000;
          broadcast(this,(ActionMessage *)local_1c8);
          sendDisconnect(this,cmd_global_disconnect);
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_stop);
          BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
LAB_002ebb2e:
          ActionMessage::~ActionMessage((ActionMessage *)local_1c8);
          CLI::std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_1e8);
          return;
        }
        ActionMessage::ActionMessage((ActionMessage *)local_1c8,cmd_warning);
        local_1c8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
        local_1c8._4_4_ = 0xfffffffe;
        pcStack_d0 = CLI::std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2963:17)>
                     ::_M_invoke;
        local_d8 = CLI::std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2963:17)>
                   ::_M_manager;
        local_e8 = (undefined1  [8])this;
        pAStack_e0 = (ActionMessage *)local_1c8;
        UnknownHandleManager::processNonOptionalUnknowns
                  (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                            *)local_e8);
        if (local_d8 != (code *)0x0) {
          (*local_d8)(local_e8,local_e8,3);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_1c8);
      }
      CLI::std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_1e8);
    }
    ActionMessage::ActionMessage((ActionMessage *)local_1c8,cmd_init_grant);
    local_1c8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    BrokerBase::setBrokerState(this_00,OPERATING);
    broadcast(this,(ActionMessage *)local_1c8);
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar3->_vptr_BaseTimeCoordinator[10])(pBVar3,0);
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    iVar5 = (*pBVar3->_vptr_BaseTimeCoordinator[9])(pBVar3,0x8831d580);
    if ((char)iVar5 == '\0') {
      (this->super_BrokerBase).enteredExecutionMode = true;
    }
    BrokerBase::logFlush(this_00);
  }
  else {
    ActionMessage::ActionMessage((ActionMessage *)local_1c8,cmd_init_grant);
    local_1c8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    pcStack_1b0 = (code *)((ulong)pcStack_1b0 | 0x10000);
    BrokerBase::setBrokerState(&this->super_BrokerBase,CONNECTED);
    pBVar8 = (this->mBrokers).dataStorage.
             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->mBrokers).dataStorage.
             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pBVar8 != pBVar1) {
      do {
        if (((pBVar8->_nonLocal == false) && (pBVar8->state < DISCONNECTED)) &&
           (pBVar8->initIterating == true)) {
          pBVar8->initIterating = false;
          pBVar8->state = CONNECTED;
          local_1b8 = (code *)CONCAT44(local_1b8._4_4_,(pBVar8->global_id).gid);
          (*(this->super_Broker)._vptr_Broker[0x22])
                    (this,(ulong)(uint)(pBVar8->route).rid,local_1c8);
        }
        pBVar8 = pBVar8 + 1;
      } while (pBVar8 != pBVar1);
    }
    (this->super_BrokerBase).field_0x296 = 0;
  }
  ActionMessage::~ActionMessage((ActionMessage *)local_1c8);
  return;
}

Assistant:

void CoreBroker::executeInitializationOperations(bool iterating)
{
    if (iterating) {
        ActionMessage init(CMD_INIT_GRANT);
        init.source_id = global_broker_id_local;
        setActionFlag(init, iteration_requested_flag);
        setBrokerState(BrokerState::CONNECTED);
        mBrokers.apply([&init, this](auto& broker) {
            if ((!broker._nonLocal) && (broker.state < ConnectionState::DISCONNECTED)) {
                if (broker.initIterating) {
                    broker.initIterating = false;
                    broker.state = ConnectionState::CONNECTED;
                    init.dest_id = broker.global_id;
                    transmit(broker.route, init);
                }
            }
        });
        initIterating = false;
        return;
    }
    if (brokerKey == universalKey) {
        LOG_SUMMARY(global_broker_id_local, getIdentifier(), "Broker started with universal key");
    }
    checkDependencies();
    if (!mTimeMonitorFederate.empty()) {
        loadTimeMonitor(true, std::string_view{});
    }
    if (unknownHandles.hasUnknowns()) {
        unknownHandles.processUnknownLinks([this](const std::string& origin,
                                                  InterfaceType originType,
                                                  const std::string& target,
                                                  InterfaceType targetType) {
            const auto* originHandle = handles.getInterfaceHandle(origin, originType);
            if (originHandle != nullptr) {
                const auto* targetHandle = handles.getInterfaceHandle(target, targetType);
                if (targetHandle != nullptr) {
                    if (originType == InterfaceType::PUBLICATION) {
                        ActionMessage datalink(CMD_DATA_LINK);
                        datalink.name(originHandle->key);
                        datalink.setString(targetStringLoc, targetHandle->key);
                        linkInterfaces(datalink);
                    } else if (originType == InterfaceType::ENDPOINT &&
                               targetType == InterfaceType::ENDPOINT) {
                        ActionMessage eptlink(CMD_ENDPOINT_LINK);
                        eptlink.name(originHandle->key);
                        eptlink.setString(targetStringLoc, targetHandle->key);
                        linkInterfaces(eptlink);
                    }
                    // TODO(PT):: make this work for filters
                }
            }
        });
        std::vector<std::vector<std::string>> foundAliasHandles;
        foundAliasHandles.resize(4);
        bool useRegex{false};
        unknownHandles.processUnknowns(
            [this, &foundAliasHandles, &useRegex](const std::string& target,
                                                  InterfaceType type,
                                                  UnknownHandleManager::TargetInfo /*target*/) {
                const auto* info = handles.getInterfaceHandle(target, type);
                if (info == nullptr) {
                    if (!useRegex) {
                        if (target.compare(0, 6, regexKey) == 0) {
                            useRegex = true;
                        }
                    }
                    return;
                }
                switch (type) {
                    case InterfaceType::PUBLICATION:
                        foundAliasHandles[0].emplace_back(target);
                        break;
                    case InterfaceType::INPUT:
                        foundAliasHandles[1].emplace_back(target);
                        break;
                    case InterfaceType::ENDPOINT:
                        foundAliasHandles[2].emplace_back(target);
                        break;
                    case InterfaceType::FILTER:
                        foundAliasHandles[3].emplace_back(target);
                        break;
                    default:
                        break;
                }
            });
        if (!foundAliasHandles[0].empty()) {
            for (const auto& target : foundAliasHandles[0]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::PUBLICATION);
                findAndNotifyPublicationTargets(*info, target);
            }
        }
        if (!foundAliasHandles[1].empty()) {
            for (const auto& target : foundAliasHandles[1]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::INPUT);
                findAndNotifyInputTargets(*info, target);
            }
        }
        if (!foundAliasHandles[2].empty()) {
            for (const auto& target : foundAliasHandles[2]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::ENDPOINT);
                findAndNotifyEndpointTargets(*info, target);
            }
        }
        if (!foundAliasHandles[3].empty()) {
            for (const auto& target : foundAliasHandles[3]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::FILTER);
                findAndNotifyFilterTargets(*info, target);
            }
        }
        if (useRegex) {
            unknownHandles.processUnknowns([this](const std::string& target,
                                                  InterfaceType type,
                                                  UnknownHandleManager::TargetInfo tinfo) {
                if (target.compare(0, 6, regexKey) == 0) {
                    findRegexMatch(target, type, tinfo.first, tinfo.second);
                }
            });
            unknownHandles.clearUnknownsIf([](const std::string& target,
                                              InterfaceType /*type*/,
                                              UnknownHandleManager::TargetInfo /*tinfo*/) {
                return (target.compare(0, 6, regexKey) == 0);
            });
        }
        /** now do a check on the unknownLinks*/

        if (errorOnUnmatchedConnections) {
            if (unknownHandles.hasUnknowns()) {
                int unmatchedCount{0};
                ActionMessage eMiss(CMD_ERROR);
                eMiss.source_id = global_broker_id_local;
                eMiss.messageID = defs::Errors::CONNECTION_FAILURE;
                std::string errorString{"unmatched connections"};

                unknownHandles.processUnknowns(
                    [&errorString, &unmatchedCount](const std::string& target,
                                                    InterfaceType type,
                                                    UnknownHandleManager::TargetInfo /*tinfo*/) {
                        errorString.append(fmt::format("\nUnable to connect {} to target {}",
                                                       interfaceTypeName(type),
                                                       target));
                        ++unmatchedCount;
                    });

                unknownHandles.processUnknownLinks(
                    [this, &errorString, &unmatchedCount](const std::string& origin,
                                                          InterfaceType originType,
                                                          const std::string& target,
                                                          InterfaceType targetType) {
                        const auto* originHandle = handles.getInterfaceHandle(origin, originType);
                        if (originHandle != nullptr) {
                            const auto* targetHandle =
                                handles.getInterfaceHandle(target, targetType);
                            if (targetHandle != nullptr) {
                                return;
                            }
                        }
                        ++unmatchedCount;
                        errorString.append(
                            fmt::format("\nUnable to make link between {} and {}", origin, target));
                    });
                if (unmatchedCount > 0) {
                    LOG_ERROR(parent_broker_id, getIdentifier(), errorString);
                    eMiss.payload = errorString;
                    eMiss.dest_handle = InterfaceHandle{};
                    broadcast(eMiss);
                    sendDisconnect(CMD_GLOBAL_DISCONNECT);
                    addActionMessage(CMD_STOP);
                    return;
                }
            }
        }
        if (unknownHandles.hasNonOptionalUnknowns()) {
            if (unknownHandles.hasRequiredUnknowns()) {
                ActionMessage eMiss(CMD_ERROR);
                eMiss.source_id = global_broker_id_local;
                eMiss.messageID = defs::Errors::CONNECTION_FAILURE;
                unknownHandles.processRequiredUnknowns(
                    [this, &eMiss](const std::string& target,
                                   InterfaceType type,
                                   UnknownHandleManager::TargetInfo tinfo) {
                        eMiss.payload = fmt::format("Unable to connect to required {} target {}",
                                                    interfaceTypeName(type),
                                                    target);
                        LOG_ERROR(parent_broker_id, getIdentifier(), eMiss.payload.to_string());

                        eMiss.setDestination(tinfo.first);
                        routeMessage(eMiss);
                    });
                eMiss.payload = "Missing required connections";
                eMiss.dest_handle = InterfaceHandle{};
                broadcast(eMiss);
                sendDisconnect(CMD_GLOBAL_DISCONNECT);
                addActionMessage(CMD_STOP);
                return;
            }
            ActionMessage wMiss(CMD_WARNING);
            wMiss.source_id = global_broker_id_local;
            wMiss.messageID = defs::Errors::CONNECTION_FAILURE;
            unknownHandles.processNonOptionalUnknowns(
                [this, &wMiss](const std::string& target,
                               InterfaceType type,
                               UnknownHandleManager::TargetInfo tinfo) {
                    wMiss.payload = fmt::format("Unable to connect to {} target {}",
                                                interfaceTypeName(type),
                                                target);
                    LOG_WARNING(parent_broker_id, getIdentifier(), wMiss.payload.to_string());

                    wMiss.setDestination(tinfo.first);
                    routeMessage(wMiss);
                });
        }
    }

    ActionMessage init(CMD_INIT_GRANT);
    init.source_id = global_broker_id_local;
    setBrokerState(BrokerState::OPERATING);
    broadcast(init);
    timeCoord->enteringExecMode();
    auto res = timeCoord->checkExecEntry();
    if (res == MessageProcessingResult::NEXT_STEP) {
        enteredExecutionMode = true;
    }
    logFlush();
}